

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CordInputStream::CordInputStream(CordInputStream *this,Cord *cord)

{
  size_t sVar1;
  Cord *cord_local;
  CordInputStream *this_local;
  
  ZeroCopyInputStream::ZeroCopyInputStream(&this->super_ZeroCopyInputStream);
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__CordInputStream_00a3e548;
  absl::lts_20250127::Cord::char_begin(&this->it_,cord);
  sVar1 = absl::lts_20250127::Cord::size(cord);
  this->length_ = sVar1;
  this->bytes_remaining_ = this->length_;
  LoadChunkData(this);
  return;
}

Assistant:

CordInputStream::CordInputStream(const absl::Cord* cord)
    : it_(cord->char_begin()),
      length_(cord->size()),
      bytes_remaining_(length_) {
  LoadChunkData();
}